

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  uint64_t uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong local_60;
  
  if (len < 0x41) {
    uVar5 = farmhashna::Hash64(s,len);
    uVar8 = (uVar5 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar8 = (uVar8 >> 0x2f ^ seed1 ^ uVar8) * -0x622015f714c7d297;
    uVar5 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297;
  }
  else {
    uVar8 = (ulong)((uint)(len - 1) & 0x3f);
    plVar6 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    if (s + (len - 0x40) != (char *)((uVar8 - 0x3f) + (long)plVar6)) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x271,
                    "uint64_t farmhashuo::Hash64WithSeeds(const char *, size_t, uint64_t, uint64_t)"
                   );
    }
    uVar15 = 0;
    lVar21 = seed0 * -0x651e95c4d06fbfb1;
    lVar14 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar11 = (ulong)(lVar14 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar14 * -0x651e95c4d06fbfb1;
    local_60 = uVar11 * -0x651e95c4d06fbfb1;
    lVar18 = seed0 + uVar11 * 0x651e95c4d06fbfb1;
    lVar12 = 0;
    lVar7 = (ulong)((uint)lVar18 & 0x82) + 0x9ae16a3b2f90404f;
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar4 = *(long *)((long)s + 0x30);
      lVar23 = *(long *)((long)s + 8);
      uVar11 = (local_60 + *plVar1) * lVar7;
      lVar13 = uVar15 + *(long *)((long)s + 0x38);
      uVar15 = lVar14 + *(long *)((long)s + 0x10);
      uVar22 = lVar21 + *(long *)s + lVar23;
      lVar14 = lVar18 + *(long *)((long)s + 0x38);
      lVar16 = (uVar11 >> 0x20 | uVar11 << 0x20) + lVar13;
      lVar18 = *(long *)s + lVar4 + lVar16 * 9;
      plVar2 = (long *)((long)s + 0x20);
      uVar11 = seed0 + *plVar2;
      lVar19 = (uVar11 >> 0x21 | uVar11 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar3 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      uVar9 = seed1 + lVar23 + *plVar3;
      uVar11 = (uVar22 >> 0x1a | uVar22 << 0x26) * 9;
      local_60 = uVar15 >> 0x1d | uVar15 << 0x23;
      lVar14 = lVar14 + lVar19;
      lVar23 = uVar11 + lVar23;
      lVar21 = lVar23 - lVar14;
      uVar15 = lVar4 + *plVar3 + lVar13 + lVar16 + lVar21;
      seed0 = lVar19 + lVar21;
      lVar12 = (lVar12 + lVar4 ^ uVar11) * 9 + *plVar2;
      lVar21 = lVar23 + uVar15;
      uVar15 = uVar15 >> 0x22 | uVar15 * 0x40000000;
      seed1 = (uVar9 >> 0x1e | uVar9 << 0x22) + *plVar1 + lVar12;
      lVar12 = lVar12 + seed1;
    } while ((long *)s != plVar6);
    uVar17 = seed0 >> 0x14 | seed0 << 0x2c;
    uVar10 = seed1 >> 0x1c | seed1 << 0x24;
    lVar16 = lVar18 * 9 + lVar14;
    uVar22 = lVar14 + lVar16;
    lVar14 = *(long *)((long)plVar6 + (uVar8 - 0x37));
    uVar11 = *(ulong *)((long)plVar6 + (uVar8 - 0xf));
    lVar18 = *(long *)((long)plVar6 + (uVar8 - 0x17));
    lVar4 = *(long *)((long)plVar6 + (uVar8 - 0x2f));
    lVar23 = uVar10 * lVar7 + *(long *)((long)plVar6 + (uVar8 - 0x3f));
    uVar9 = (uVar17 - lVar21) + lVar14 + uVar22;
    uVar22 = uVar10 ^ uVar11 ^ uVar22;
    uVar20 = lVar14 + lVar4 + lVar23;
    uVar9 = uVar15 * 9 ^ (uVar9 >> 0x25 | uVar9 * 0x8000000) * lVar7;
    uVar10 = uVar17 + lVar18 + (uVar22 >> 0x2a | uVar22 << 0x16) * lVar7;
    local_60 = local_60 + lVar12 + uVar8;
    uVar22 = local_60 >> 0x21 | local_60 * 0x80000000;
    lVar14 = *(long *)((long)plVar6 + (uVar8 - 7));
    lVar21 = uVar22 * lVar7;
    lVar13 = uVar15 + lVar21 + *(long *)((long)plVar6 + (uVar8 - 0x1f));
    uVar17 = lVar18 + uVar11 + lVar13;
    uVar11 = lVar4 + uVar10 + lVar14 + lVar13;
    uVar24 = uVar17 + lVar14 ^ uVar10;
    lVar14 = *(long *)((long)plVar6 + (uVar8 - 0x27)) + uVar9;
    uVar8 = lVar12 + uVar8 + lVar23 + lVar14;
    uVar15 = (uVar20 + lVar14 ^ uVar24) * lVar7;
    uVar11 = lVar13 + lVar21 + (uVar17 >> 0x2c | uVar17 * 0x100000) +
             (uVar11 >> 0x15 | uVar11 << 0x2b);
    uVar8 = ((uVar20 >> 0x2c | uVar20 * 0x100000) + lVar23 + uVar10 +
             (uVar8 >> 0x15 | uVar8 << 0x2b) ^ uVar11) * -0x651e95c4d06fbfb1;
    uVar15 = (uVar15 >> 0x2f ^ uVar24 ^ uVar15) * lVar7;
    uVar8 = uVar8 >> 0x2f ^ uVar11 ^ uVar8;
    uVar9 = (uVar8 * -0x41befec400000000 | uVar8 * -0x651e95c4d06fbfb1 >> 0x1e) *
            -0x651e95c4d06fbfb1 ^ uVar9;
    uVar8 = (((uVar15 >> 0x2f ^ uVar15) + uVar22) * lVar7 - lVar16 ^ uVar9) * -0x651e95c4d06fbfb1;
    uVar8 = uVar8 >> 0x2f ^ uVar9 ^ uVar8;
    uVar5 = (uVar8 * 0x5f20809e00000000 | uVar8 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar5;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}